

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void ClipperLib::OpenPathsFromPolyTree(PolyTree *polytree,Paths *paths)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(paths,0);
  iVar2 = (int)((ulong)(*(long *)(polytree + 0x58) - (long)*(long **)(polytree + 0x50)) >> 3);
  if (0 < iVar2) {
    iVar2 = iVar2 - (uint)(**(long **)(polytree + 0x20) != **(long **)(polytree + 0x50));
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(paths,(long)iVar2);
  lVar3 = *(long *)(polytree + 0x20);
  lVar4 = *(long *)(polytree + 0x28);
  if (0 < (int)((ulong)(lVar4 - lVar3) >> 3)) {
    lVar5 = 0;
    do {
      lVar1 = *(long *)(lVar3 + lVar5 * 8);
      if (*(char *)(lVar1 + 0x44) == '\x01') {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back(paths,(value_type *)(lVar1 + 8));
        lVar3 = *(long *)(polytree + 0x20);
        lVar4 = *(long *)(polytree + 0x28);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)((ulong)(lVar4 - lVar3) >> 3));
  }
  return;
}

Assistant:

void OpenPathsFromPolyTree(PolyTree& polytree, Paths& paths)
{
  paths.resize(0); 
  paths.reserve(polytree.Total());
  //Open paths are top level only, so ...
  for (int i = 0; i < polytree.ChildCount(); ++i)
    if (polytree.Childs[i]->IsOpen())
      paths.push_back(polytree.Childs[i]->Contour);
}